

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestHugeFieldNumbersLite::set_allocated_oneof_test_all_types
          (TestHugeFieldNumbersLite *this,TestAllTypesLite *oneof_test_all_types)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (oneof_test_all_types != (TestAllTypesLite *)0x0) {
    submessage_arena = (Arena *)(oneof_test_all_types->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      oneof_test_all_types =
           (TestAllTypesLite *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&oneof_test_all_types->super_MessageLite,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 0x1ffffc7c;
    (this->field_0)._impl_.oneof_field_.oneof_test_all_types_ = oneof_test_all_types;
  }
  return;
}

Assistant:

void TestHugeFieldNumbersLite::set_allocated_oneof_test_all_types(::proto2_unittest::TestAllTypesLite* PROTOBUF_NULLABLE oneof_test_all_types) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_test_all_types) {
    ::google::protobuf::Arena* submessage_arena = oneof_test_all_types->GetArena();
    if (message_arena != submessage_arena) {
      oneof_test_all_types = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_test_all_types, submessage_arena);
    }
    set_has_oneof_test_all_types();
    _impl_.oneof_field_.oneof_test_all_types_ = oneof_test_all_types;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestHugeFieldNumbersLite.oneof_test_all_types)
}